

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialog::setOption(QColorDialog *this,ColorDialogOption option,bool on)

{
  ColorDialogOptions CVar1;
  
  CVar1 = options(this);
  if ((((uint)CVar1.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
              super_QFlagsStorage<QColorDialog::ColorDialogOption>.i & option) == 0) != on) {
    return;
  }
  setOptions(this,(ColorDialogOptions)
                  ((uint)CVar1.super_QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4>.
                         super_QFlagsStorage<QColorDialog::ColorDialogOption>.i ^ option));
  return;
}

Assistant:

void QColorDialog::setOption(ColorDialogOption option, bool on)
{
    const QColorDialog::ColorDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}